

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

FileInfo *
llbuild::basic::FileInfo::getInfoForPath(FileInfo *__return_storage_ptr__,string *path,bool asLink)

{
  bool bVar1;
  char *pcVar2;
  int local_d4;
  __syscall_slong_t nanoseconds;
  __time_t seconds;
  undefined1 auStack_a8 [4];
  int statResult;
  StatStruct buf;
  bool asLink_local;
  string *path_local;
  
  buf.__glibc_reserved[2]._7_1_ = asLink;
  FileInfo(__return_storage_ptr__);
  if ((buf.__glibc_reserved[2]._7_1_ & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_d4 = sys::stat(pcVar2,(stat *)auStack_a8);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_d4 = sys::lstat(pcVar2,(stat *)auStack_a8);
  }
  if (local_d4 == 0) {
    __return_storage_ptr__->device = _auStack_a8;
    __return_storage_ptr__->inode = buf.st_dev;
    __return_storage_ptr__->mode = (ulong)(uint)buf.st_nlink;
    __return_storage_ptr__->size = buf.st_rdev;
    (__return_storage_ptr__->modTime).seconds = buf.st_atim.tv_nsec;
    (__return_storage_ptr__->modTime).nanoseconds = buf.st_mtim.tv_sec;
    bVar1 = isMissing(__return_storage_ptr__);
    if (bVar1) {
      (__return_storage_ptr__->modTime).nanoseconds = 1;
      bVar1 = isMissing(__return_storage_ptr__);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!result.isMissing()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/FileInfo.cpp"
                      ,0x40,
                      "static FileInfo llbuild::basic::FileInfo::getInfoForPath(const std::string &, bool)"
                     );
      }
    }
  }
  else {
    memset(__return_storage_ptr__,0,0x50);
    bVar1 = isMissing(__return_storage_ptr__);
    if (!bVar1) {
      __assert_fail("result.isMissing()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/FileInfo.cpp"
                    ,0x28,
                    "static FileInfo llbuild::basic::FileInfo::getInfoForPath(const std::string &, bool)"
                   );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FileInfo FileInfo::getInfoForPath(const std::string& path, bool asLink) {
  FileInfo result;

  sys::StatStruct buf;
  auto statResult =
    asLink ? sys::lstat(path.c_str(), &buf) : sys::stat(path.c_str(), &buf);
  if (statResult != 0) {
    memset(&result, 0, sizeof(result));
    assert(result.isMissing());
    return result;
  }

  result.device = buf.st_dev;
  result.inode = buf.st_ino;
  result.mode = buf.st_mode;
  result.size = buf.st_size;
#if defined(__APPLE__)
  auto seconds = buf.st_mtimespec.tv_sec;
  auto nanoseconds = buf.st_mtimespec.tv_nsec;
#elif defined(_WIN32)
  auto seconds = buf.st_mtime;
  auto nanoseconds = 0;
#else
  auto seconds = buf.st_mtim.tv_sec;
  auto nanoseconds = buf.st_mtim.tv_nsec;
#endif
  result.modTime.seconds = seconds;
  result.modTime.nanoseconds = nanoseconds;

  // Enforce we never accidentally create our sentinel missing file value.
  if (result.isMissing()) {
    result.modTime.nanoseconds = 1;
    assert(!result.isMissing());
  }

  return result;
}